

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_blockhash_by_height(any *context,HTTPRequest *req,string *str_uri_part)

{
  long lVar1;
  string str;
  string key;
  span<const_std::byte,_18446744073709551615UL> reply;
  int32_t iVar2;
  bool bVar3;
  RESTResponseFormat RVar4;
  ChainstateManager *this;
  Chainstate *pCVar5;
  CBlockIndex *this_00;
  string *this_01;
  int iVar6;
  long in_FS_OFFSET;
  string_view str_00;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  string_view str_01;
  undefined4 uStack_1e8;
  int32_t blockheight;
  string local_1e0 [24];
  UniValue in_stack_fffffffffffffe38;
  string local_168 [32];
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined1 local_d0 [32];
  span<const_std::byte,_18446744073709551615UL> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string height_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CheckWarmup(req);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_007d394f;
  }
  height_str._M_dataplus._M_p = (pointer)&height_str.field_2;
  height_str._M_string_length = 0;
  height_str.field_2._M_local_buf[0] = '\0';
  RVar4 = ParseDataFormat(&height_str,str_uri_part);
  blockheight = -1;
  str_01._M_str = height_str._M_dataplus._M_p;
  str_01._M_len = height_str._M_string_length;
  bVar3 = ParseInt32(str_01,&blockheight);
  if (bVar3 && -1 < blockheight) {
    this = GetChainman(context,req);
    if (this == (ChainstateManager *)0x0) goto LAB_007d3940;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock13,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp",
               0x3cd,false);
    pCVar5 = ChainstateManager::ActiveChainstate(this);
    iVar2 = blockheight;
    iVar6 = (int)((ulong)((long)(pCVar5->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar5->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (blockheight < iVar6) {
      this_00 = CChain::operator[](&pCVar5->m_chain,blockheight);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_d0 + 0x40),"Block height out of range",
                 (allocator<char> *)(local_d0 + 0x20));
      RESTERR(req,HTTP_NOT_FOUND,(string *)(local_d0 + 0x40));
      std::__cxx11::string::~string((string *)(local_d0 + 0x40));
      this_00 = (CBlockIndex *)0x0;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
    if (iVar6 <= iVar2) goto LAB_007d3940;
    if (RVar4 == BINARY) {
      criticalblock13.super_unique_lock._M_device = (mutex_type *)0x0;
      criticalblock13.super_unique_lock._M_owns = false;
      criticalblock13.super_unique_lock._9_7_ = 0;
      CBlockIndex::GetBlockHash((uint256 *)(local_d0 + 0x20),this_00);
      base_blob<256U>::Serialize<DataStream>
                ((base_blob<256U> *)(local_d0 + 0x20),(DataStream *)&criticalblock13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_d0 + 0x20),"Content-Type",
                 (allocator<char> *)((long)&uStack_1e8 + 3));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,"application/octet-stream",
                 (allocator<char> *)((long)&uStack_1e8 + 2));
      HTTPRequest::WriteHeader(req,(string *)(local_d0 + 0x20),(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
      reply_00._M_extent._M_extent_value =
           criticalblock13.super_unique_lock._8_8_ -
           (long)criticalblock13.super_unique_lock._M_device;
      reply_00._M_ptr = (pointer)criticalblock13.super_unique_lock._M_device;
      HTTPRequest::WriteReply(req,200,reply_00);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&criticalblock13)
      ;
    }
    else if (RVar4 == HEX) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock13,"Content-Type",(allocator<char> *)local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_d0 + 0x20),"text/plain",(allocator<char> *)((long)&uStack_1e8 + 3)
                );
      HTTPRequest::WriteHeader(req,(string *)&criticalblock13,(string *)(local_d0 + 0x20));
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
      std::__cxx11::string::~string((string *)&criticalblock13);
      CBlockIndex::GetBlockHash((uint256 *)local_d0,this_00);
      base_blob<256u>::GetHex_abi_cxx11_((string *)(local_d0 + 0x20),(base_blob<256u> *)local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &criticalblock13,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d0 + 0x20),"\n");
      reply._M_extent._M_extent_value = criticalblock13.super_unique_lock._8_8_;
      reply._M_ptr = (pointer)criticalblock13.super_unique_lock._M_device;
      HTTPRequest::WriteReply(req,200,reply);
      std::__cxx11::string::~string((string *)&criticalblock13);
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
    }
    else {
      if (RVar4 != JSON) {
        AvailableDataFormatsString_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &criticalblock13,"output format not found (available: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_d0 + 0x20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &criticalblock13,")");
        RESTERR(req,HTTP_NOT_FOUND,(string *)local_1e0);
        std::__cxx11::string::~string(local_1e0);
        std::__cxx11::string::~string((string *)&criticalblock13);
        this_01 = (string *)(local_d0 + 0x20);
        goto LAB_007d371c;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock13,"Content-Type",(allocator<char> *)local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_d0 + 0x20),"application/json",
                 (allocator<char> *)((long)&uStack_1e8 + 3));
      HTTPRequest::WriteHeader(req,(string *)&criticalblock13,(string *)(local_d0 + 0x20));
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
      std::__cxx11::string::~string((string *)&criticalblock13);
      local_148 = local_138;
      local_140 = 0;
      local_138[0] = 0;
      str._M_dataplus._M_p._4_4_ = blockheight;
      str._M_dataplus._M_p._0_4_ = uStack_1e8;
      str._8_24_ = local_1e0;
      UniValue::UniValue((UniValue *)&criticalblock13,VOBJ,str);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::string<std::allocator<char>>
                (local_168,"blockhash",(allocator<char> *)((long)&uStack_1e8 + 3));
      CBlockIndex::GetBlockHash((uint256 *)local_d0,this_00);
      base_blob<256u>::GetHex_abi_cxx11_((string *)(local_d0 + 0x20),(base_blob<256u> *)local_d0);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)&stack0xfffffffffffffe40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d0 + 0x20));
      key._M_dataplus._M_p._4_4_ = blockheight;
      key._M_dataplus._M_p._0_4_ = uStack_1e8;
      key._8_24_ = local_1e0;
      UniValue::pushKV((UniValue *)&criticalblock13,key,in_stack_fffffffffffffe38);
      UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe40);
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
      std::__cxx11::string::~string(local_168);
      UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)&criticalblock13,(void *)0x0,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "\n");
      HTTPRequest::WriteReply(req,200,local_b0);
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
      std::__cxx11::string::~string((string *)local_d0);
      UniValue::~UniValue((UniValue *)&criticalblock13);
    }
    bVar3 = true;
  }
  else {
    str_00._M_str = height_str._M_dataplus._M_p;
    str_00._M_len = height_str._M_string_length;
    SanitizeString_abi_cxx11_((string *)&criticalblock13,str_00,0);
    std::operator+(&local_70,"Invalid height: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock13);
    RESTERR(req,HTTP_BAD_REQUEST,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_01 = (string *)&criticalblock13;
LAB_007d371c:
    std::__cxx11::string::~string(this_01);
LAB_007d3940:
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&height_str);
LAB_007d394f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_blockhash_by_height(const std::any& context, HTTPRequest* req,
                       const std::string& str_uri_part)
{
    if (!CheckWarmup(req)) return false;
    std::string height_str;
    const RESTResponseFormat rf = ParseDataFormat(height_str, str_uri_part);

    int32_t blockheight = -1; // Initialization done only to prevent valgrind false positive, see https://github.com/bitcoin/bitcoin/pull/18785
    if (!ParseInt32(height_str, &blockheight) || blockheight < 0) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid height: " + SanitizeString(height_str));
    }

    CBlockIndex* pblockindex = nullptr;
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        const CChain& active_chain = chainman.ActiveChain();
        if (blockheight > active_chain.Height()) {
            return RESTERR(req, HTTP_NOT_FOUND, "Block height out of range");
        }
        pblockindex = active_chain[blockheight];
    }
    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ss_blockhash{};
        ss_blockhash << pblockindex->GetBlockHash();
        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ss_blockhash);
        return true;
    }
    case RESTResponseFormat::HEX: {
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, pblockindex->GetBlockHash().GetHex() + "\n");
        return true;
    }
    case RESTResponseFormat::JSON: {
        req->WriteHeader("Content-Type", "application/json");
        UniValue resp = UniValue(UniValue::VOBJ);
        resp.pushKV("blockhash", pblockindex->GetBlockHash().GetHex());
        req->WriteReply(HTTP_OK, resp.write() + "\n");
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}